

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

void sysbvm_astInterpreter_setupNodeInterpretationFunctions
               (sysbvm_context_t *context,sysbvm_tuple_t astNodeType,
               sysbvm_functionEntryPoint_t analysisFunction,
               sysbvm_functionEntryPoint_t evaluationFunction,
               sysbvm_functionEntryPoint_t analysisAndEvaluationFunction)

{
  sysbvm_tuple_t sVar1;
  
  if (analysisFunction != (sysbvm_functionEntryPoint_t)0x0) {
    sVar1 = sysbvm_function_createPrimitive(context,2,0,(void *)0x0,analysisFunction);
    sysbvm_type_setAstNodeAnalysisFunction(context,astNodeType,sVar1);
  }
  if (evaluationFunction != (sysbvm_functionEntryPoint_t)0x0) {
    sVar1 = sysbvm_function_createPrimitive(context,2,0,(void *)0x0,evaluationFunction);
    sysbvm_type_setAstNodeEvaluationFunction(context,astNodeType,sVar1);
  }
  if (analysisAndEvaluationFunction != (sysbvm_functionEntryPoint_t)0x0) {
    sVar1 = sysbvm_function_createPrimitive(context,2,0,(void *)0x0,analysisAndEvaluationFunction);
    sysbvm_type_setAstNodeAnalysisAndEvaluationFunction(context,astNodeType,sVar1);
    return;
  }
  return;
}

Assistant:

static void sysbvm_astInterpreter_setupNodeInterpretationFunctions(sysbvm_context_t *context, sysbvm_tuple_t astNodeType, sysbvm_functionEntryPoint_t analysisFunction, sysbvm_functionEntryPoint_t evaluationFunction, sysbvm_functionEntryPoint_t analysisAndEvaluationFunction)
{
    if(analysisFunction)
        sysbvm_type_setAstNodeAnalysisFunction(context, astNodeType, sysbvm_function_createPrimitive(context, 2, SYSBVM_FUNCTION_FLAGS_NONE, NULL, analysisFunction));
    if(evaluationFunction)
        sysbvm_type_setAstNodeEvaluationFunction(context, astNodeType, sysbvm_function_createPrimitive(context, 2, SYSBVM_FUNCTION_FLAGS_NONE, NULL, evaluationFunction));
    if(analysisAndEvaluationFunction)
        sysbvm_type_setAstNodeAnalysisAndEvaluationFunction(context, astNodeType, sysbvm_function_createPrimitive(context, 2, SYSBVM_FUNCTION_FLAGS_NONE, NULL, analysisAndEvaluationFunction));
}